

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_findfile.c
# Opt level: O0

char * findfile(char *fname,int dotscore)

{
  __uid_t __uid;
  char *pcVar1;
  passwd *ppVar2;
  int local_64;
  char *home_1;
  passwd *pw;
  char *c;
  char *filename;
  char *path;
  char *home;
  int i;
  int dotscore_local;
  char *fname_local;
  
  if (*fname == '\0') {
    fname_local = (char *)0x0;
  }
  else {
    home._0_4_ = 0;
    home._4_4_ = dotscore;
    while (conf_list[(int)home].env != (char *)0x0) {
      pcVar1 = (char *)curl_getenv(conf_list[(int)home].env);
      if (pcVar1 != (char *)0x0) {
        if (*pcVar1 == '\0') {
          curl_free(pcVar1);
        }
        else {
          path = pcVar1;
          if (conf_list[(int)home].append != (char *)0x0) {
            path = (char *)curl_maprintf("%s%s",pcVar1,conf_list[(int)home].append);
            curl_free(pcVar1);
            if (path == (char *)0x0) {
              return (char *)0x0;
            }
          }
          c = fname;
          if ((conf_list[(int)home].withoutdot & 1U) != 0) {
            if (home._4_4_ == 0) {
              curl_free(path);
              goto LAB_0010f082;
            }
            c = fname + 1;
            home._4_4_ = 0;
          }
          if (home._4_4_ == 0) {
            local_64 = 0;
          }
          else {
            local_64 = home._4_4_ + -1;
          }
          pcVar1 = checkhome(path,c,local_64 != 0);
          curl_free(path);
          if (pcVar1 != (char *)0x0) {
            return pcVar1;
          }
        }
      }
LAB_0010f082:
      home._0_4_ = (int)home + 1;
    }
    __uid = geteuid();
    ppVar2 = getpwuid(__uid);
    if (((ppVar2 == (passwd *)0x0) || (pcVar1 = ppVar2->pw_dir, pcVar1 == (char *)0x0)) ||
       (*pcVar1 == '\0')) {
      fname_local = (char *)0x0;
    }
    else {
      fname_local = checkhome(pcVar1,fname,false);
    }
  }
  return fname_local;
}

Assistant:

char *findfile(const char *fname, int dotscore)
{
  int i;
  DEBUGASSERT(fname && fname[0]);
  DEBUGASSERT((dotscore != 1) || (fname[0] == '.'));

  if(!fname[0])
    return NULL;

  for(i = 0; conf_list[i].env; i++) {
    char *home = curl_getenv(conf_list[i].env);
    if(home) {
      char *path;
      const char *filename = fname;
      if(!home[0]) {
        curl_free(home);
        continue;
      }
      if(conf_list[i].append) {
        char *c = aprintf("%s%s", home, conf_list[i].append);
        curl_free(home);
        if(!c)
          return NULL;
        home = c;
      }
      if(conf_list[i].withoutdot) {
        if(!dotscore) {
          /* this is not looking for .curlrc, or the XDG_CONFIG_HOME was
             defined so we skip the extended check */
          curl_free(home);
          continue;
        }
        filename++; /* move past the leading dot */
        dotscore = 0; /* disable it for this check */
      }
      path = checkhome(home, filename, dotscore ? dotscore - 1 : 0);
      curl_free(home);
      if(path)
        return path;
    }
  }
#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
  {
    struct passwd *pw = getpwuid(geteuid());
    if(pw) {
      char *home = pw->pw_dir;
      if(home && home[0])
        return checkhome(home, fname, FALSE);
    }
  }
#endif /* PWD-stuff */
  return NULL;
}